

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O3

uint64_t aom_var_2d_u8_sse2(uint8_t *src,int src_stride,int width,int height)

{
  byte bVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined8 uVar14;
  undefined1 auVar15 [15];
  unkuint9 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  undefined1 auVar20 [11];
  undefined1 auVar21 [13];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  long lVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  uint uVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined8 auStack_a8 [5];
  __m128i vsrc [8];
  
  if (width < 0x10) {
    uVar29 = 0;
    lVar28 = 0;
    lVar26 = 0;
  }
  else {
    uVar29 = 0;
    lVar26 = 0;
    lVar28 = 0;
    do {
      pauVar30 = (undefined1 (*) [16])(src + uVar29);
      if (height < 8) {
        uVar32 = 0;
      }
      else {
        iVar27 = 0;
        do {
          lVar33 = 0;
          do {
            uVar14 = *(undefined8 *)(*pauVar30 + 8);
            *(undefined8 *)((long)auStack_a8 + lVar33) = *(undefined8 *)*pauVar30;
            *(undefined8 *)((long)auStack_a8 + lVar33 + 8) = uVar14;
            pauVar30 = (undefined1 (*) [16])(*pauVar30 + src_stride);
            lVar33 = lVar33 + 0x10;
          } while (lVar33 != 0x80);
          iVar34 = 0;
          iVar35 = 0;
          iVar36 = 0;
          iVar37 = 0;
          sVar38 = 0;
          sVar39 = 0;
          sVar40 = 0;
          sVar41 = 0;
          sVar42 = 0;
          sVar43 = 0;
          sVar44 = 0;
          sVar45 = 0;
          lVar33 = 0;
          do {
            auVar46 = *(undefined1 (*) [16])((long)auStack_a8 + lVar33);
            auVar2[0xd] = 0;
            auVar2._0_13_ = auVar46._0_13_;
            auVar2[0xe] = auVar46[7];
            auVar4[0xc] = auVar46[6];
            auVar4._0_12_ = auVar46._0_12_;
            auVar4._13_2_ = auVar2._13_2_;
            auVar6[0xb] = 0;
            auVar6._0_11_ = auVar46._0_11_;
            auVar6._12_3_ = auVar4._12_3_;
            auVar8[10] = auVar46[5];
            auVar8._0_10_ = auVar46._0_10_;
            auVar8._11_4_ = auVar6._11_4_;
            auVar10[9] = 0;
            auVar10._0_9_ = auVar46._0_9_;
            auVar10._10_5_ = auVar8._10_5_;
            auVar12[8] = auVar46[4];
            auVar12._0_8_ = auVar46._0_8_;
            auVar12._9_6_ = auVar10._9_6_;
            auVar15._7_8_ = 0;
            auVar15._0_7_ = auVar12._8_7_;
            Var16 = CONCAT81(SUB158(auVar15 << 0x40,7),auVar46[3]);
            auVar22._9_6_ = 0;
            auVar22._0_9_ = Var16;
            auVar17._1_10_ = SUB1510(auVar22 << 0x30,5);
            auVar17[0] = auVar46[2];
            auVar23._11_4_ = 0;
            auVar23._0_11_ = auVar17;
            auVar18._1_12_ = SUB1512(auVar23 << 0x20,3);
            auVar18[0] = auVar46[1];
            auVar48._0_2_ = CONCAT11(0,auVar46[0]);
            auVar48._2_13_ = auVar18;
            auVar48[0xf] = 0;
            auVar50._0_2_ = CONCAT11(0,auVar46[8]);
            auVar50[2] = auVar46[9];
            auVar50[3] = 0;
            auVar50[4] = auVar46[10];
            auVar50[5] = 0;
            auVar50[6] = auVar46[0xb];
            auVar50[7] = 0;
            auVar50[8] = auVar46[0xc];
            auVar50[9] = 0;
            auVar50[10] = auVar46[0xd];
            auVar50[0xb] = 0;
            auVar50[0xc] = auVar46[0xe];
            auVar50[0xd] = 0;
            auVar50[0xe] = auVar46[0xf];
            auVar50[0xf] = 0;
            sVar38 = sVar38 + auVar48._0_2_ + auVar50._0_2_;
            sVar39 = sVar39 + auVar18._0_2_ + (ushort)auVar46[9];
            sVar40 = sVar40 + auVar17._0_2_ + (ushort)auVar46[10];
            sVar41 = sVar41 + (short)Var16 + (ushort)auVar46[0xb];
            sVar42 = sVar42 + auVar12._8_2_ + (ushort)auVar46[0xc];
            sVar43 = sVar43 + auVar8._10_2_ + (ushort)auVar46[0xd];
            sVar44 = sVar44 + auVar4._12_2_ + (ushort)auVar46[0xe];
            sVar45 = sVar45 + (auVar2._13_2_ >> 8) + (ushort)auVar46[0xf];
            auVar48 = pmaddwd(auVar48,auVar48);
            auVar46 = pmaddwd(auVar50,auVar50);
            iVar34 = auVar46._0_4_ + auVar48._0_4_ + iVar34;
            iVar35 = auVar46._4_4_ + auVar48._4_4_ + iVar35;
            iVar36 = auVar46._8_4_ + auVar48._8_4_ + iVar36;
            iVar37 = auVar46._12_4_ + auVar48._12_4_ + iVar37;
            lVar33 = lVar33 + 0x10;
          } while (lVar33 != 0x80);
          lVar26 = lVar26 + (ulong)(ushort)(sVar45 + sVar41 + sVar43 + sVar39 +
                                           sVar44 + sVar40 + sVar42 + sVar38);
          lVar28 = lVar28 + (iVar37 + iVar35 + iVar36 + iVar34);
          iVar27 = iVar27 + 8;
          uVar32 = height & 0xfffffff8;
        } while (iVar27 < height + -7);
      }
      iVar34 = 0;
      iVar35 = 0;
      iVar36 = 0;
      iVar37 = 0;
      sVar38 = 0;
      sVar39 = 0;
      sVar40 = 0;
      sVar41 = 0;
      sVar42 = 0;
      sVar43 = 0;
      sVar44 = 0;
      sVar45 = 0;
      iVar27 = height - uVar32;
      if (iVar27 != 0 && (int)uVar32 <= height) {
        do {
          auVar46 = *pauVar30;
          auVar3[0xd] = 0;
          auVar3._0_13_ = auVar46._0_13_;
          auVar3[0xe] = auVar46[7];
          auVar5[0xc] = auVar46[6];
          auVar5._0_12_ = auVar46._0_12_;
          auVar5._13_2_ = auVar3._13_2_;
          auVar7[0xb] = 0;
          auVar7._0_11_ = auVar46._0_11_;
          auVar7._12_3_ = auVar5._12_3_;
          auVar9[10] = auVar46[5];
          auVar9._0_10_ = auVar46._0_10_;
          auVar9._11_4_ = auVar7._11_4_;
          auVar11[9] = 0;
          auVar11._0_9_ = auVar46._0_9_;
          auVar11._10_5_ = auVar9._10_5_;
          auVar13[8] = auVar46[4];
          auVar13._0_8_ = auVar46._0_8_;
          auVar13._9_6_ = auVar11._9_6_;
          auVar19._7_8_ = 0;
          auVar19._0_7_ = auVar13._8_7_;
          Var16 = CONCAT81(SUB158(auVar19 << 0x40,7),auVar46[3]);
          auVar24._9_6_ = 0;
          auVar24._0_9_ = Var16;
          auVar20._1_10_ = SUB1510(auVar24 << 0x30,5);
          auVar20[0] = auVar46[2];
          auVar25._11_4_ = 0;
          auVar25._0_11_ = auVar20;
          auVar21._1_12_ = SUB1512(auVar25 << 0x20,3);
          auVar21[0] = auVar46[1];
          auVar49._0_2_ = CONCAT11(0,auVar46[0]);
          auVar49._2_13_ = auVar21;
          auVar49[0xf] = 0;
          auVar47._0_2_ = CONCAT11(0,auVar46[8]);
          auVar47[2] = auVar46[9];
          auVar47[3] = 0;
          auVar47[4] = auVar46[10];
          auVar47[5] = 0;
          auVar47[6] = auVar46[0xb];
          auVar47[7] = 0;
          auVar47[8] = auVar46[0xc];
          auVar47[9] = 0;
          auVar47[10] = auVar46[0xd];
          auVar47[0xb] = 0;
          auVar47[0xc] = auVar46[0xe];
          auVar47[0xd] = 0;
          auVar47[0xe] = auVar46[0xf];
          auVar47[0xf] = 0;
          sVar38 = sVar38 + auVar49._0_2_ + auVar47._0_2_;
          sVar39 = sVar39 + auVar21._0_2_ + (ushort)auVar46[9];
          sVar40 = sVar40 + auVar20._0_2_ + (ushort)auVar46[10];
          sVar41 = sVar41 + (short)Var16 + (ushort)auVar46[0xb];
          sVar42 = sVar42 + auVar13._8_2_ + (ushort)auVar46[0xc];
          sVar43 = sVar43 + auVar9._10_2_ + (ushort)auVar46[0xd];
          sVar44 = sVar44 + auVar5._12_2_ + (ushort)auVar46[0xe];
          sVar45 = sVar45 + (auVar3._13_2_ >> 8) + (ushort)auVar46[0xf];
          auVar50 = pmaddwd(auVar49,auVar49);
          auVar46 = pmaddwd(auVar47,auVar47);
          iVar34 = auVar46._0_4_ + auVar50._0_4_ + iVar34;
          iVar35 = auVar46._4_4_ + auVar50._4_4_ + iVar35;
          iVar36 = auVar46._8_4_ + auVar50._8_4_ + iVar36;
          iVar37 = auVar46._12_4_ + auVar50._12_4_ + iVar37;
          pauVar30 = (undefined1 (*) [16])(*pauVar30 + src_stride);
          iVar27 = iVar27 + -1;
        } while (iVar27 != 0);
      }
      lVar26 = lVar26 + (ulong)(ushort)(sVar45 + sVar41 + sVar43 + sVar39 +
                                       sVar44 + sVar40 + sVar42 + sVar38);
      lVar28 = lVar28 + (iVar37 + iVar35 + iVar36 + iVar34);
      uVar29 = uVar29 + 0x10;
    } while (uVar29 < width - 0xf);
  }
  if (0 < height) {
    iVar27 = 0;
    do {
      uVar31 = uVar29 & 0xffffffff;
      if ((int)uVar29 < width) {
        do {
          bVar1 = src[uVar31];
          lVar26 = lVar26 + (ulong)bVar1;
          lVar28 = lVar28 + (ulong)((uint)bVar1 * (uint)bVar1);
          uVar31 = uVar31 + 1;
        } while ((uint)width != uVar31);
      }
      src = src + src_stride;
      iVar27 = iVar27 + 1;
    } while (iVar27 != height);
  }
  return lVar28 - (ulong)(lVar26 * lVar26) / (ulong)(long)(height * width);
}

Assistant:

uint64_t aom_var_2d_u8_sse2(uint8_t *src, int src_stride, int width,
                            int height) {
  uint8_t *srcp;
  uint64_t s = 0, ss = 0;
  __m128i vzero = _mm_setzero_si128();
  __m128i v_acc_sum = vzero;
  __m128i v_acc_sqs = vzero;
  int i, j;

  // Process 16 elements in a row
  for (i = 0; i < width - 15; i += 16) {
    srcp = src + i;
    // Process 8 columns at a time
    for (j = 0; j < height - 7; j += 8) {
      __m128i vsrc[8];
      for (int k = 0; k < 8; k++) {
        vsrc[k] = _mm_loadu_si128((__m128i *)srcp);
        srcp += src_stride;
      }
      for (int k = 0; k < 8; k++) {
        __m128i vsrc0 = _mm_unpacklo_epi8(vsrc[k], vzero);
        __m128i vsrc1 = _mm_unpackhi_epi8(vsrc[k], vzero);
        v_acc_sum = _mm_add_epi16(v_acc_sum, vsrc0);
        v_acc_sum = _mm_add_epi16(v_acc_sum, vsrc1);

        __m128i vsqs0 = _mm_madd_epi16(vsrc0, vsrc0);
        __m128i vsqs1 = _mm_madd_epi16(vsrc1, vsrc1);
        v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs0);
        v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs1);
      }

      // Update total sum and clear the vectors
      s += mm_accumulate_epi16(v_acc_sum);
      ss += mm_accumulate_epi32(v_acc_sqs);
      v_acc_sum = vzero;
      v_acc_sqs = vzero;
    }

    // Process remaining rows (height not a multiple of 8)
    for (; j < height; j++) {
      __m128i vsrc = _mm_loadu_si128((__m128i *)srcp);
      __m128i vsrc0 = _mm_unpacklo_epi8(vsrc, vzero);
      __m128i vsrc1 = _mm_unpackhi_epi8(vsrc, vzero);
      v_acc_sum = _mm_add_epi16(v_acc_sum, vsrc0);
      v_acc_sum = _mm_add_epi16(v_acc_sum, vsrc1);

      __m128i vsqs0 = _mm_madd_epi16(vsrc0, vsrc0);
      __m128i vsqs1 = _mm_madd_epi16(vsrc1, vsrc1);
      v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs0);
      v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs1);

      srcp += src_stride;
    }

    // Update total sum and clear the vectors
    s += mm_accumulate_epi16(v_acc_sum);
    ss += mm_accumulate_epi32(v_acc_sqs);
    v_acc_sum = vzero;
    v_acc_sqs = vzero;
  }

  // Process the remaining area using C
  srcp = src;
  for (int k = 0; k < height; k++) {
    for (int m = i; m < width; m++) {
      uint8_t val = srcp[m];
      s += val;
      ss += val * val;
    }
    srcp += src_stride;
  }
  return (ss - s * s / (width * height));
}